

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsValueRef
WScriptJsrt::LoadScriptFileHelper
          (JsValueRef callee,JsValueRef *arguments,unsigned_short argumentCount,bool isSourceModule)

{
  bool bVar1;
  JsErrorCode errorCode;
  HRESULT HVar2;
  PAL_FILE *stream;
  undefined7 in_register_00000009;
  char16_t *errorMessage;
  LPCSTR pCVar3;
  undefined1 auStack_88 [8];
  AutoString fileName;
  AutoString scriptInjectType;
  LPCSTR local_40;
  LPCSTR fileContent;
  JsValueRef returnValue;
  
  fileContent = (LPCSTR)0x0;
  if ((ushort)(argumentCount - 5) < 0xfffd) {
    errorMessage = L"Need more or fewer arguments for WScript.LoadScript";
    errorCode = JsErrorInvalidArgument;
    goto LAB_0010ee7d;
  }
  pCVar3 = (LPCSTR)(CONCAT71(in_register_00000009,isSourceModule) & 0xffffffff);
  fileName.data._0_5_ = 0;
  fileName._13_8_ = 0;
  auStack_88 = (undefined1  [8])0x0;
  fileName.length._0_5_ = 0;
  fileName.length._5_3_ = 0;
  AutoString::Initialize((AutoString *)auStack_88,arguments[1]);
  if ((JsErrorCode)fileName.data_wide == JsNoError) {
    fileName.errorCode = JsNoError;
    fileName.dontFree = false;
    fileName._29_3_ = 0;
    if ((argumentCount < 3) ||
       (errorCode = AutoString::Initialize((AutoString *)&fileName.errorCode,arguments[2]),
       errorCode == JsNoError)) {
      HVar2 = Helpers::LoadScriptFromFile
                        ((LPCSTR)CONCAT35(fileName.length._5_3_,(undefined5)fileName.length),
                         &local_40,(UINT *)0x0,(string *)0x0,false);
      if (HVar2 < 0) {
        stream = PAL_get_stderr(0);
        PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",
                    CONCAT35(fileName.length._5_3_,(undefined5)fileName.length));
        errorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&fileContent);
        if (errorCode != JsNoError) goto LAB_0010ee58;
        bVar1 = true;
        errorCode = JsNoError;
        pCVar3 = fileContent;
      }
      else {
        fileContent = (LPCSTR)LoadScript(callee,(LPCSTR)CONCAT35(fileName.length._5_3_,
                                                                 (undefined5)fileName.length),
                                         local_40,"self",SUB81(pCVar3,0),FinalizeFree,true);
        errorCode = JsNoError;
        bVar1 = false;
      }
    }
    else {
LAB_0010ee58:
      bVar1 = false;
    }
    AutoString::~AutoString((AutoString *)&fileName.errorCode);
  }
  else {
    bVar1 = false;
    errorCode = (JsErrorCode)fileName.data_wide;
  }
  AutoString::~AutoString((AutoString *)auStack_88);
  if (bVar1) {
    return pCVar3;
  }
  errorMessage = L"";
LAB_0010ee7d:
  SetExceptionIf(errorCode,errorMessage);
  return fileContent;
}

Assistant:

JsValueRef WScriptJsrt::LoadScriptFileHelper(JsValueRef callee, JsValueRef *arguments, unsigned short argumentCount, bool isSourceModule)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;
    LPCWSTR errorMessage = _u("");

    if (argumentCount < 2 || argumentCount > 4)
    {
        errorCode = JsErrorInvalidArgument;
        errorMessage = _u("Need more or fewer arguments for WScript.LoadScript");
    }
    else
    {
        LPCSTR fileContent;
        AutoString fileName(arguments[1]);
        IfJsrtErrorSetGo(fileName.GetError());

        AutoString scriptInjectType;
        if (argumentCount > 2)
        {
            IfJsrtErrorSetGo(scriptInjectType.Initialize(arguments[2]));
        }

        if (errorCode == JsNoError)
        {
            hr = Helpers::LoadScriptFromFile(*fileName, fileContent);
            if (FAILED(hr))
            {
                fprintf(stderr, "Couldn't load file '%s'\n", fileName.GetString());
                IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
                return returnValue;
            }

            returnValue = LoadScript(callee, *fileName, fileContent, *scriptInjectType ? *scriptInjectType : "self", isSourceModule, WScriptJsrt::FinalizeFree, true);
        }
    }

Error:

    SetExceptionIf(errorCode, errorMessage);
    return returnValue;
}